

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkLevel(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  ulong uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  bool bVar5;
  int *__s;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  
  if ((pNtk->pManTime == (Abc_ManTime_t *)0x0) || (pNtk->AndGateDelay <= 0.0)) {
    pVVar6 = pNtk->vCis;
    if (0 < pVVar6->nSize) {
      lVar13 = 0;
      do {
        puVar1 = (uint *)((long)pVVar6->pArray[lVar13] + 0x14);
        *puVar1 = *puVar1 & 0xfff;
        lVar13 = lVar13 + 1;
        pVVar6 = pNtk->vCis;
      } while (lVar13 < pVVar6->nSize);
    }
  }
  else {
    pVVar6 = pNtk->vCis;
    if (0 < pVVar6->nSize) {
      lVar13 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pVVar6->pArray[lVar13];
        fVar14 = Abc_NodeReadArrivalWorst(pAVar3);
        fVar15 = 0.0;
        if (0.0 <= fVar14) {
          fVar15 = fVar14;
        }
        *(uint *)&pAVar3->field_0x14 =
             *(uint *)&pAVar3->field_0x14 & 0xfff | (int)(fVar15 / pNtk->AndGateDelay) << 0xc;
        lVar13 = lVar13 + 1;
        pVVar6 = pNtk->vCis;
      } while (lVar13 < pVVar6->nSize);
    }
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar7 = pNtk->vObjs->nSize;
    uVar2 = (long)iVar7 + 500;
    iVar12 = (int)uVar2;
    if ((pNtk->vTravIds).nCap < iVar12) {
      __s = (int *)malloc(uVar2 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar12;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar7) {
      memset(__s,0,(uVar2 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar7 = pNtk->nTravIds;
  pNtk->nTravIds = iVar7 + 1;
  if (iVar7 < 0x3fffffff) {
    if (pNtk->nBarBufs == 0) {
      pVVar6 = pNtk->vObjs;
      if (0 < pVVar6->nSize) {
        lVar13 = 0;
        uVar10 = 0;
        uVar11 = 0;
        do {
          pAVar3 = (Abc_Obj_t *)pVVar6->pArray[lVar13];
          if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
            Abc_NtkLevel_rec(pAVar3);
            uVar8 = *(uint *)&pAVar3->field_0x14 >> 0xc;
            bVar5 = uVar11 <= uVar8;
            uVar11 = uVar10;
            if (bVar5) {
              uVar11 = uVar8;
            }
            pVVar6 = pNtk->vObjs;
            uVar10 = uVar11;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar6->nSize);
        return uVar11;
      }
    }
    else {
      pVVar6 = pNtk->vCos;
      iVar7 = pVVar6->nSize;
      if (0 < iVar7) {
        uVar11 = 0;
        iVar12 = 0;
        do {
          iVar9 = 0;
          if (iVar12 < pNtk->nBarBufs) {
            iVar9 = iVar7;
          }
          uVar10 = (iVar9 - pNtk->nBarBufs) + iVar12;
          if (((int)uVar10 < 0) || (iVar7 <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar4 = (long *)pVVar6->pArray[uVar10];
          pAVar3 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
          Abc_NtkLevel_rec(pAVar3);
          uVar10 = *(uint *)&pAVar3->field_0x14;
          uVar8 = uVar10 >> 0xc;
          if (uVar11 <= uVar8) {
            uVar11 = uVar8;
          }
          if (iVar12 < pNtk->nBarBufs) {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[6] * 8);
            lVar13 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                              (long)*(int *)plVar4[6] * 8);
            *(uint *)(lVar13 + 0x14) = *(uint *)(lVar13 + 0x14) & 0xfff | uVar10 & 0xfffff000;
          }
          iVar12 = iVar12 + 1;
          pVVar6 = pNtk->vCos;
          iVar7 = pVVar6->nSize;
        } while (iVar12 < iVar7);
        return uVar11;
      }
    }
    return 0;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CI levels
    if ( pNtk->pManTime == NULL || pNtk->AndGateDelay <= 0 )
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = 0;
    else
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pNode)) / pNtk->AndGateDelay);
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    if ( pNtk->nBarBufs == 0 )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_NtkLevel_rec( pNode );
            if ( LevelsMax < (int)pNode->Level )
                LevelsMax = (int)pNode->Level;
        }
    }
    else
    {
        Abc_NtkForEachLiPo( pNtk, pNode, i )
        {
            Abc_Obj_t * pDriver = Abc_ObjFanin0(pNode);
            Abc_NtkLevel_rec( pDriver );
            if ( LevelsMax < (int)pDriver->Level )
                LevelsMax = (int)pDriver->Level;
            // transfer the delay
            if ( i < pNtk->nBarBufs )
                Abc_ObjFanout0(Abc_ObjFanout0(pNode))->Level = pDriver->Level;
        }
    }
    return LevelsMax;
}